

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_body(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq,char **tep)

{
  char *pcVar1;
  undefined1 *puVar2;
  HTTP *pHVar3;
  _Bool _Var4;
  CURLcode CVar5;
  curl_mimepart *pcVar6;
  char *pcVar7;
  char *pcVar8;
  curl_off_t cVar9;
  
  pHVar3 = (data->req).p.http;
  pHVar3->postsize = 0;
  if (httpreq == HTTPREQ_POST_FORM) {
    if ((data->state).formp != (curl_mimepart *)0x0) goto LAB_0013c1fe;
    pcVar6 = (curl_mimepart *)(*Curl_ccalloc)(1,0x1b8);
    (data->state).formp = pcVar6;
    if (pcVar6 == (curl_mimepart *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_mime_cleanpart(pcVar6);
    CVar5 = Curl_getformdata(data,(data->state).formp,(data->set).httppost,(data->state).fread_func)
    ;
    if (CVar5 != CURLE_OK) {
      (*Curl_cfree)((data->state).formp);
      (data->state).formp = (curl_mimepart *)0x0;
      return CVar5;
    }
    pcVar6 = (data->state).formp;
  }
  else if (httpreq == HTTPREQ_POST_MIME) {
    pcVar6 = &(data->set).mimepost;
  }
  else {
    pcVar6 = (curl_mimepart *)0x0;
  }
  (data->state).mimepost = pcVar6;
LAB_0013c1fe:
  if ((data->state).mimepost != (curl_mimepart *)0x0) {
    pcVar7 = Curl_checkheaders(data,"Content-Type",0xc);
    pcVar6 = (data->state).mimepost;
    pcVar6->flags = pcVar6->flags | 2;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      if (pcVar6->kind == MIMEKIND_MULTIPART) {
        pcVar7 = "multipart/form-data";
      }
    }
    else {
      pcVar8 = pcVar7 + 0xc;
      do {
        pcVar7 = pcVar8 + 1;
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar7;
      } while (*pcVar1 == ' ');
    }
    curl_mime_headers(pcVar6,(data->set).headers,0);
    CVar5 = Curl_mime_prepare_headers
                      (data,(data->state).mimepost,pcVar7,(char *)0x0,MIMESTRATEGY_FORM);
    curl_mime_headers((data->state).mimepost,(curl_slist *)0x0,0);
    if (CVar5 == CURLE_OK) {
      CVar5 = Curl_mime_rewind((data->state).mimepost);
    }
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    cVar9 = Curl_mime_size((data->state).mimepost);
    pHVar3->postsize = cVar9;
  }
  pcVar7 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
  if (pcVar7 == (char *)0x0) {
    if (((conn->handler->protocol & 3) == 0) ||
       ((((httpreq & ~HTTPREQ_POST) != HTTPREQ_POST_FORM || (-1 < pHVar3->postsize)) &&
        (((httpreq != HTTPREQ_POST && ((*(uint *)&(data->state).field_0x74c & 0x100000) == 0)) ||
         ((data->state).infilesize != -1)))))) {
      puVar2 = &(data->req).field_0xbc;
      *puVar2 = *puVar2 & 0xfd;
    }
    else if (((conn->bits).field_0x2 & 1) == 0) {
      if ((((data->state).httpversion == '\n') || (conn->httpversion == '\n')) ||
         ((data->state).httpwant == '\x01')) {
        Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
      if (conn->httpversion < 0x14) {
        puVar2 = &(data->req).field_0xbc;
        *puVar2 = *puVar2 | 2;
      }
    }
    if (((data->req).field_0xbc & 2) != 0) {
      *tep = "Transfer-Encoding: chunked\r\n";
    }
  }
  else {
    _Var4 = Curl_compareheader(pcVar7,"Transfer-Encoding:",0x12,"chunked",7);
    *(ushort *)&(data->req).field_0xbb =
         *(ushort *)&(data->req).field_0xbb & 0xfdff | (ushort)_Var4 << 9;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_body(struct Curl_easy *data, struct connectdata *conn,
                        Curl_HttpReq httpreq, const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;
  struct HTTP *http = data->req.p.http;
  http->postsize = 0;

  switch(httpreq) {
  case HTTPREQ_POST_MIME:
    data->state.mimepost = &data->set.mimepost;
    break;
#ifndef CURL_DISABLE_FORM_API
  case HTTPREQ_POST_FORM:
    /* Convert the form structure into a mime structure, then keep
       the conversion */
    if(!data->state.formp) {
      data->state.formp = calloc(1, sizeof(curl_mimepart));
      if(!data->state.formp)
        return CURLE_OUT_OF_MEMORY;
      Curl_mime_cleanpart(data->state.formp);
      result = Curl_getformdata(data, data->state.formp, data->set.httppost,
                                data->state.fread_func);
      if(result) {
        Curl_safefree(data->state.formp);
        return result;
      }
      data->state.mimepost = data->state.formp;
    }
    break;
#endif
  default:
    data->state.mimepost = NULL;
  }

#ifndef CURL_DISABLE_MIME
  if(data->state.mimepost) {
    const char *cthdr = Curl_checkheaders(data, STRCONST("Content-Type"));

    /* Read and seek body only. */
    data->state.mimepost->flags |= MIME_BODY_ONLY;

    /* Prepare the mime structure headers & set content type. */

    if(cthdr)
      for(cthdr += 13; *cthdr == ' '; cthdr++)
        ;
    else if(data->state.mimepost->kind == MIMEKIND_MULTIPART)
      cthdr = "multipart/form-data";

    curl_mime_headers(data->state.mimepost, data->set.headers, 0);
    result = Curl_mime_prepare_headers(data, data->state.mimepost, cthdr,
                                       NULL, MIMESTRATEGY_FORM);
    curl_mime_headers(data->state.mimepost, NULL, 0);
    if(!result)
      result = Curl_mime_rewind(data->state.mimepost);
    if(result)
      return result;
    http->postsize = Curl_mime_size(data->state.mimepost);
  }
#endif

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
  }
  else {
    if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
       (((httpreq == HTTPREQ_POST_MIME || httpreq == HTTPREQ_POST_FORM) &&
         http->postsize < 0) ||
        ((data->state.upload || httpreq == HTTPREQ_POST) &&
         data->state.infilesize == -1))) {
      if(conn->bits.authneg)
        /* don't enable chunked during auth neg */
        ;
      else if(Curl_use_http_1_1plus(data, conn)) {
        if(conn->httpversion < 20)
          /* HTTP, upload, unknown file size and not HTTP 1.0 */
          data->req.upload_chunky = TRUE;
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}